

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O3

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,SamplingStrategyResponse *response)

{
  bool bVar1;
  const_reference json_00;
  pointer pbVar2;
  const_iterator result;
  const_iterator itr;
  undefined1 local_88 [64];
  const_iterator local_48;
  
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"strategyType","");
  json_00 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(json,(key_type *)local_88);
  from_json(json_00,(type *)&local_48);
  SamplingStrategyResponse::__set_strategyType(response,(type)local_48.m_object);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[22]>(&local_48,json,(char (*) [22])"probabilisticSampling");
  local_88._8_8_ = (_Base_ptr)0x0;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0x8000000000000000;
  local_88._0_8_ = json;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)local_88);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_48,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_88);
  if (!bVar1) {
    pbVar2 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator->(&local_48);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_0>
              ((ProbabilisticSamplingStrategy *)local_88,pbVar2);
    SamplingStrategyResponse::__set_probabilisticSampling
              (response,(ProbabilisticSamplingStrategy *)local_88);
    ProbabilisticSamplingStrategy::~ProbabilisticSamplingStrategy
              ((ProbabilisticSamplingStrategy *)local_88);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[21]>((const_iterator *)local_88,json,(char (*) [21])"rateLimitingSampling");
  local_48.m_object = (pointer)local_88._0_8_;
  local_48.m_it.object_iterator._M_node = (_Base_ptr)local_88._8_8_;
  local_48.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)local_88._16_8_;
  local_48.m_it.primitive_iterator.m_it = local_88._24_8_;
  local_88._8_8_ = (_Base_ptr)0x0;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0x8000000000000000;
  local_88._0_8_ = json;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)local_88);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_48,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_88);
  if (!bVar1) {
    pbVar2 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator->(&local_48);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy,_jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy,_0>
              ((RateLimitingSamplingStrategy *)local_88,pbVar2);
    SamplingStrategyResponse::__set_rateLimitingSampling
              (response,(RateLimitingSamplingStrategy *)local_88);
    RateLimitingSamplingStrategy::~RateLimitingSamplingStrategy
              ((RateLimitingSamplingStrategy *)local_88);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[18]>((const_iterator *)local_88,json,(char (*) [18])"operationSampling");
  local_48.m_object = (pointer)local_88._0_8_;
  local_48.m_it.primitive_iterator.m_it = local_88._24_8_;
  local_48.m_it.object_iterator._M_node = (_Base_ptr)local_88._8_8_;
  local_48.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)local_88._16_8_;
  local_88._8_8_ = (_Base_ptr)0x0;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0x8000000000000000;
  local_88._0_8_ = json;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)local_88);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_48,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_88);
  if (!bVar1) {
    pbVar2 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator->(&local_48);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies,_jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies,_0>
              ((PerOperationSamplingStrategies *)local_88,pbVar2);
    SamplingStrategyResponse::__set_operationSampling
              (response,(PerOperationSamplingStrategies *)local_88);
    PerOperationSamplingStrategies::~PerOperationSamplingStrategies
              ((PerOperationSamplingStrategies *)local_88);
  }
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      SamplingStrategyResponse& response)
{
    FIELD_FROM_JSON(response, strategyType);
    auto itr = json.find("probabilisticSampling");
    if (itr != std::end(json)) {
        response.__set_probabilisticSampling(
            itr->get<ProbabilisticSamplingStrategy>());
    }
    itr = json.find("rateLimitingSampling");
    if (itr != std::end(json)) {
        response.__set_rateLimitingSampling(
            itr->get<RateLimitingSamplingStrategy>());
    }
    itr = json.find("operationSampling");
    if (itr != std::end(json)) {
        response.__set_operationSampling(
            itr->get<PerOperationSamplingStrategies>());
    }
}